

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_compare.cpp
# Opt level: O3

bool Omega_h::CompareArrays<long>::compare
               (CommPtr *comm,Read<long> *a,Read<long> *b,VarCompareOpts opts,Int ncomps,Int dim,
               bool verbose)

{
  int *piVar1;
  Comm *this;
  char *__s;
  Alloc *pAVar2;
  bool x;
  bool bVar3;
  LO LVar4;
  I32 IVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  LO j;
  long lVar9;
  HostRead<long> h_b;
  char local_99;
  Int local_98;
  uint local_94;
  HostRead<long> local_90;
  Read<long> local_80;
  Read<signed_char> local_70;
  HostRead<long> local_60;
  Read<signed_char> local_50;
  Read<long> local_40;
  
  if (opts.type == NONE) {
    bVar3 = true;
  }
  else {
    local_80.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
        local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_80.write_.shared_alloc_.alloc =
             (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_80.write_.shared_alloc_.alloc)->use_count =
             (local_80.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_80.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    local_40.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
        local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_40.write_.shared_alloc_.alloc =
             (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_40.write_.shared_alloc_.alloc)->use_count =
             (local_40.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_40.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
    local_98 = ncomps;
    local_94 = dim;
    x = operator==(&local_80,&local_40);
    pAVar2 = local_40.write_.shared_alloc_.alloc;
    if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
        local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_80.write_.shared_alloc_.alloc;
    if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
        local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    bVar3 = Comm::reduce_and((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,x);
    if (verbose && !bVar3) {
      local_50.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_50.write_.shared_alloc_.alloc =
               (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_50.write_.shared_alloc_.alloc)->use_count =
               (local_50.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_50.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
      HostRead<long>::HostRead(&local_90,&local_50);
      pAVar2 = local_50.write_.shared_alloc_.alloc;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      local_70.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
          local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_70.write_.shared_alloc_.alloc =
               (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_70.write_.shared_alloc_.alloc)->use_count =
               (local_70.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_70.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
      HostRead<long>::HostRead(&local_60,&local_70);
      pAVar2 = local_70.write_.shared_alloc_.alloc;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
          local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      this = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      LVar4 = HostRead<long>::size(&local_90);
      Comm::exscan<long>(this,(long)LVar4,OMEGA_H_SUM);
      IVar5 = 0x7fffffff;
      if (!x) {
        IVar5 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
      }
      iVar6 = Comm::allreduce<int>
                        ((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,IVar5,OMEGA_H_MIN);
      IVar5 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      if (IVar5 == iVar6) {
        lVar9 = 0;
        while( true ) {
          LVar4 = HostRead<long>::size(&local_90);
          if (LVar4 <= lVar9) break;
          if (*(long *)((long)local_90.read_.write_.shared_alloc_.direct_ptr + lVar9 * 8) !=
              *(long *)((long)local_60.read_.write_.shared_alloc_.direct_ptr + lVar9 * 8)) {
            if (local_94 < 4) {
              __s = (&PTR_anon_var_dwarf_67e8e_004b8888)[local_94];
              sVar7 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar7);
            }
            else {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4c3378);
            }
            local_99 = ' ';
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,&local_99,1);
            poVar8 = std::ostream::_M_insert<long>((long)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," comp ",6);
            poVar8 = std::ostream::_M_insert<long>((long)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            poVar8 = std::ostream::_M_insert<long>((long)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," != ",4);
            poVar8 = std::ostream::_M_insert<long>((long)poVar8);
            local_99 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_99,1);
            break;
          }
          lVar9 = lVar9 + 1;
        }
      }
      if (((ulong)local_60.read_.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_60.read_.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_60.read_.write_.shared_alloc_.alloc);
          operator_delete(local_60.read_.write_.shared_alloc_.alloc,0x48);
        }
      }
      if (((ulong)local_90.read_.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_90.read_.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_90.read_.write_.shared_alloc_.alloc);
          operator_delete(local_90.read_.write_.shared_alloc_.alloc,0x48);
        }
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

static bool compare(CommPtr comm, Read<T> a, Read<T> b, VarCompareOpts opts,
      Int ncomps, Int dim, bool verbose) {
    if (opts.type == VarCompareOpts::NONE) return true;
    auto this_rank_matches = (a == b);
    if (comm->reduce_and(this_rank_matches)) return true;
    if (!verbose) return false;
    /* if integer arrays are different, we find the first mismatching
       value and print it out as a place for users to start
       tracking down the issue */
    auto h_a = HostRead<T>(a);
    auto h_b = HostRead<T>(b);
    auto global_start = comm->exscan(GO(h_a.size()), OMEGA_H_SUM);
    I32 rank_cand = ArithTraits<I32>::max();
    if (!this_rank_matches) rank_cand = comm->rank();
    // only the first mismatching rank prints
    auto best_rank = comm->allreduce(rank_cand, OMEGA_H_MIN);
    if (comm->rank() == best_rank) {
      for (LO j = 0; j < h_a.size(); ++j) {
        // and it only prints its first mismatching value
        if (h_a[j] != h_b[j]) {
          auto global_comp = global_start + GO(j);
          auto global_ent = global_comp / ncomps;
          auto comp = global_comp % ncomps;
          std::cout << dimensional_singular_name(dim) << ' ' << global_ent
                    << " comp " << comp << " " << I64(h_a[j])
                    << " != " << I64(h_b[j]) << '\n';
          break;
        }
      }
    }
    return false;
  }